

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O3

void __thiscall
chrono::ChSystem::StateIncrementX(ChSystem *this,ChState *x_new,ChState *x,ChStateDelta *Dx)

{
  element_type *peVar1;
  
  ChAssembly::IntStateIncrement(&this->assembly,0,x_new,x,0,Dx);
  peVar1 = (this->contact_container).
           super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x21])
            (peVar1,(ulong)((peVar1->super_ChPhysicsItem).offset_x -
                           (this->assembly).super_ChPhysicsItem.offset_x),x_new,x,
             (ulong)((peVar1->super_ChPhysicsItem).offset_w -
                    (this->assembly).super_ChPhysicsItem.offset_w),Dx);
  return;
}

Assistant:

void ChSystem::StateIncrementX(ChState& x_new, const ChState& x, const ChStateDelta& Dx) {
    unsigned int off_x = 0;
    unsigned int off_v = 0;

    // Operate on assembly sub-objects (bodies, links, etc.)
    assembly.IntStateIncrement(off_x, x_new, x, off_v, Dx);

    // Use also on contact container:
    unsigned int displ_x = off_x - assembly.offset_x;
    unsigned int displ_v = off_v - assembly.offset_w;
    contact_container->IntStateIncrement(displ_x + contact_container->GetOffset_x(), x_new, x,
                                         displ_v + contact_container->GetOffset_w(), Dx);
}